

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::add_bytes
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this,pbf_tag_type tag,char *value
          ,size_t size)

{
  assert_error *this_00;
  
  if (this->m_pos == 0) {
    if (this->m_data == (fixed_size_buffer_adaptor *)0x0) {
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"m_data");
    }
    else {
      if (size >> 0x20 == 0) {
        add_field(this,tag,length_delimited);
        add_varint(this,size);
        fixed_size_buffer_adaptor::append(this->m_data,value,size);
        return;
      }
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"size <= std::numeric_limits<pbf_length_type>::max()");
    }
  }
  else {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_bytes(pbf_tag_type tag, const char* value, std::size_t size) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        protozero_assert(size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(size));
        buffer_customization<TBuffer>::append(m_data, value, size);
    }